

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O1

int Fraig_ManPrintRefs(Fraig_Man_t *pMan)

{
  Fraig_Node_t *pNode2;
  int iVar1;
  Fraig_NodeVec_t *p;
  Fraig_NodeVec_t *pFVar2;
  long lVar3;
  Fraig_Node_t *pNew;
  ulong uVar4;
  Fraig_Node_t *pFVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  timespec ts;
  uint local_64;
  timespec local_40;
  
  p = Fraig_NodeVecAlloc(1000);
  pFVar2 = pMan->vNodes;
  uVar4 = (ulong)(uint)pFVar2->nSize;
  if (0 < pFVar2->nSize) {
    lVar6 = 0;
    do {
      pFVar5 = pFVar2->pArray[lVar6];
      if (((0xfff < *(uint *)&pFVar5->field_0x18) &&
          (*(uint *)&pFVar5->field_0x18 >> 0xc != pMan->nWordsRand << 5)) && (5 < pFVar5->nRefs)) {
        Fraig_NodeVecPush(p,pFVar5);
      }
      lVar6 = lVar6 + 1;
      pFVar2 = pMan->vNodes;
      uVar4 = (ulong)pFVar2->nSize;
    } while (lVar6 < (long)uVar4);
  }
  local_64 = 0;
  printf("Total nodes = %d. Referenced nodes = %d.\n",uVar4,(ulong)(uint)p->nSize);
  clock_gettime(3,&local_40);
  uVar9 = 0;
  if (0 < p->nSize) {
    lVar7 = 1;
    uVar9 = 0;
    local_64 = 0;
    lVar6 = 0;
    do {
      lVar3 = lVar6 + 1;
      lVar8 = lVar7;
      if (lVar3 < p->nSize) {
        do {
          pFVar5 = p->pArray[lVar6];
          pNode2 = p->pArray[lVar8];
          iVar1 = Fraig_NodeSimsContained(pMan,pFVar5,pNode2);
          pNew = pNode2;
          if ((iVar1 != 0) ||
             (iVar1 = Fraig_NodeSimsContained(pMan,pNode2,pFVar5), pNew = pFVar5, pFVar5 = pNode2,
             iVar1 != 0)) {
            iVar1 = Fraig_NodeIsImplication(pMan,pFVar5,pNew,-1);
            uVar9 = (uVar9 + 1) - (uint)(iVar1 == 0);
            local_64 = local_64 + 1;
          }
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < p->nSize);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar3;
    } while (lVar3 < p->nSize);
  }
  printf("Number of candidate pairs = %d.  Proved = %d.\n",(ulong)local_64,(ulong)uVar9);
  return 0;
}

Assistant:

int Fraig_ManPrintRefs( Fraig_Man_t * pMan )
{
    Fraig_NodeVec_t * vPivots;
    Fraig_Node_t * pNode, * pNode2;
    int i, k, Counter, nProved;
    abctime clk;

    vPivots = Fraig_NodeVecAlloc( 1000 );
    for ( i = 0; i < pMan->vNodes->nSize; i++ )
    {
        pNode = pMan->vNodes->pArray[i];

        if ( pNode->nOnes == 0 || pNode->nOnes == (unsigned)pMan->nWordsRand * 32 )
            continue;

        if ( pNode->nRefs > 5 )
        {
            Fraig_NodeVecPush( vPivots, pNode );
//            printf( "Node %6d : nRefs = %2d   Level = %3d.\n", pNode->Num, pNode->nRefs, pNode->Level );
        }
    }
    printf( "Total nodes = %d. Referenced nodes = %d.\n", pMan->vNodes->nSize, vPivots->nSize );

clk = Abc_Clock();
    // count implications
    Counter = nProved = 0;
    for ( i = 0; i < vPivots->nSize; i++ )
        for ( k = i+1; k < vPivots->nSize; k++ )
        {
            pNode  = vPivots->pArray[i];
            pNode2 = vPivots->pArray[k];
            if ( Fraig_NodeSimsContained( pMan, pNode, pNode2 ) )
            {
                if ( Fraig_NodeIsImplication( pMan, pNode, pNode2, -1 ) )
                    nProved++;
                Counter++;
            }
            else if ( Fraig_NodeSimsContained( pMan, pNode2, pNode ) )
            {
                if ( Fraig_NodeIsImplication( pMan, pNode2, pNode, -1 ) )
                    nProved++;
                Counter++;
            }
        }
    printf( "Number of candidate pairs = %d.  Proved = %d.\n", Counter, nProved );
//ABC_PRT( "Time", Abc_Clock() - clk );
    return 0;
}